

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

void __thiscall
IssuingDistributionPoint::Encode
          (IssuingDistributionPoint *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *puVar2;
  size_t sVar3;
  size_t *psVar4;
  undefined1 local_48 [8];
  EncodeHelper eh;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  IssuingDistributionPoint *this_local;
  
  eh.cbUsed = cbUsed;
  EncodeHelper::EncodeHelper((EncodeHelper *)local_48,cbUsed);
  iVar1 = (**(this->super_ExtensionBase).super_DerBase._vptr_DerBase)();
  EncodeHelper::Init((EncodeHelper *)local_48,CONCAT44(extraout_var,iVar1),pOut,cbOut,'0',
                     (this->super_ExtensionBase).super_DerBase.cbData);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<DistributionPointName,_(unsigned_char)'\xa0',_(OptionType)0>::Encode
            (&this->distributionPoint,puVar2,sVar3,psVar4);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa1',_(OptionType)0>::Encode
            (&this->onlyContainsUserCerts,puVar2,sVar3,psVar4);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa2',_(OptionType)0>::Encode
            (&this->onlyContainsCACerts,puVar2,sVar3,psVar4);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<BitString,_(unsigned_char)'\xa3',_(OptionType)0>::Encode
            (&this->onlySomeReasons,puVar2,sVar3,psVar4);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::Encode
            (&this->indirectCRL,puVar2,sVar3,psVar4);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar3 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar4 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ContextSpecificHolder<Boolean,_(unsigned_char)'\xa5',_(OptionType)0>::Encode
            (&this->onlyContainsAttributeCerts,puVar2,sVar3,psVar4);
  EncodeHelper::Finalize((EncodeHelper *)local_48);
  EncodeHelper::~EncodeHelper((EncodeHelper *)local_48);
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
    {
        EncodeHelper eh(cbUsed);

        eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);
        
        distributionPoint.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsUserCerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsCACerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlySomeReasons.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        indirectCRL.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
        eh.Update();

        onlyContainsAttributeCerts.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
		eh.Finalize();
    }